

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_string_utils.cpp
# Opt level: O3

void strsplit(string *str,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *ret,string *sep)

{
  ulong uVar1;
  long lVar2;
  string tmp;
  value_type local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (str->_M_string_length != 0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_58 = ret;
    uVar1 = std::__cxx11::string::find_first_not_of((char *)str,(ulong)(sep->_M_dataplus)._M_p,0);
    if (uVar1 != 0xffffffffffffffff) {
      do {
        lVar2 = std::__cxx11::string::find((char *)str,(ulong)(sep->_M_dataplus)._M_p,uVar1);
        if (lVar2 == -1) {
          std::__cxx11::string::substr((ulong)local_50,(ulong)str);
          std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          uVar1 = 0xffffffffffffffff;
        }
        else {
          std::__cxx11::string::substr((ulong)local_50,(ulong)str);
          std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          uVar1 = lVar2 + sep->_M_string_length;
        }
        if (local_78._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_58,&local_78);
          local_78._M_string_length = 0;
          *local_78._M_dataplus._M_p = '\0';
        }
      } while (uVar1 != 0xffffffffffffffff);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void strsplit(const std::string& str, std::vector<std::string>& ret, std::string sep)
{
  if (str.empty())
    return;

  std::string tmp;  
  std::string::size_type pos_begin = str.find_first_not_of(sep);  
  std::string::size_type comma_pos = 0;  

  while (pos_begin != std::string::npos) {
    comma_pos = str.find(sep, pos_begin);  
    if (comma_pos != std::string::npos) {
      tmp = str.substr(pos_begin, comma_pos - pos_begin);
      pos_begin = comma_pos + sep.length();
    }
    else {
      tmp = str.substr(pos_begin);
      pos_begin = comma_pos;
    }
    if (!tmp.empty()) {
      ret.push_back(tmp);
      tmp.clear();
    }
  }
}